

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cpp_wrapper1.cpp
# Opt level: O1

void cpp_wrapper_get(planck_unit_test_t *tc,Dictionary<int,_int> *dict,int key,int expected_value,
                    ion_err_t expected_status,ion_result_count_t expected_count)

{
  char cVar1;
  int32_t actual;
  planck_unit_result_t pVar2;
  int actual_00;
  undefined7 in_register_00000081;
  
  actual_00 = Dictionary<int,_int>::get(dict,key);
  cVar1 = (dict->last_status).error;
  actual = (dict->last_status).count;
  pVar2 = planck_unit_assert_int_are_equal
                    (tc,(int32_t)CONCAT71(in_register_00000081,expected_status),(int)cVar1,0xe0,
                     "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/cpp_wrapper/test1/test_cpp_wrapper1.cpp"
                    );
  if (pVar2 != '\0') {
    pVar2 = planck_unit_assert_int_are_equal
                      (tc,expected_count,actual,0xe1,
                       "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/cpp_wrapper/test1/test_cpp_wrapper1.cpp"
                      );
    if (pVar2 != '\0') {
      if (cVar1 == '\0') {
        pVar2 = planck_unit_assert_int_are_equal
                          (tc,expected_value,actual_00,0xe4,
                           "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/cpp_wrapper/test1/test_cpp_wrapper1.cpp"
                          );
        if (pVar2 == '\0') goto LAB_001039ee;
      }
      return;
    }
  }
LAB_001039ee:
  longjmp((__jmp_buf_tag *)planck_unit_longjmp_env,1);
}

Assistant:

void
cpp_wrapper_get(
	planck_unit_test_t *tc,
	Dictionary<int, int>	*dict,
	int key,
	int expected_value,
	ion_err_t expected_status,
	ion_result_count_t expected_count
) {
	int				retval	= dict->get(key);
	ion_status_t	status	= dict->last_status;

	PLANCK_UNIT_ASSERT_INT_ARE_EQUAL(tc, expected_status, status.error);
	PLANCK_UNIT_ASSERT_INT_ARE_EQUAL(tc, expected_count, status.count);

	if (err_ok == status.error) {
		PLANCK_UNIT_ASSERT_INT_ARE_EQUAL(tc, expected_value, retval);
	}
}